

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_schema_entry.cpp
# Opt level: O1

optional_ptr<duckdb::CatalogEntry,_true> __thiscall
duckdb::DuckSchemaEntry::CreateTableFunction
          (DuckSchemaEntry *this,CatalogTransaction transaction,CreateTableFunctionInfo *info)

{
  bool bVar1;
  Catalog *catalog;
  TableFunctionCatalogEntry *this_00;
  pointer pTVar2;
  optional_ptr<duckdb::CatalogEntry,_true> oVar3;
  templated_unique_single_t table_function;
  _Head_base<0UL,_duckdb::TableFunctionCatalogEntry_*,_false> local_38;
  _Head_base<0UL,_duckdb::TableFunctionCatalogEntry_*,_false> local_30;
  
  catalog = (this->super_SchemaCatalogEntry).super_InCatalogEntry.catalog;
  this_00 = (TableFunctionCatalogEntry *)operator_new(400);
  TableFunctionCatalogEntry::TableFunctionCatalogEntry
            (this_00,catalog,&this->super_SchemaCatalogEntry,info);
  bVar1 = (info->super_CreateFunctionInfo).super_CreateInfo.internal;
  local_30._M_head_impl = this_00;
  pTVar2 = unique_ptr<duckdb::TableFunctionCatalogEntry,_std::default_delete<duckdb::TableFunctionCatalogEntry>,_true>
           ::operator->((unique_ptr<duckdb::TableFunctionCatalogEntry,_std::default_delete<duckdb::TableFunctionCatalogEntry>,_true>
                         *)&local_30);
  local_38._M_head_impl = local_30._M_head_impl;
  (pTVar2->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.super_CatalogEntry.internal
       = bVar1;
  local_30._M_head_impl = (TableFunctionCatalogEntry *)0x0;
  oVar3 = AddEntry(this,transaction,
                   (unique_ptr<duckdb::StandardEntry,_std::default_delete<duckdb::StandardEntry>,_true>
                    *)&local_38,(info->super_CreateFunctionInfo).super_CreateInfo.on_conflict);
  if (local_38._M_head_impl != (TableFunctionCatalogEntry *)0x0) {
    (*((local_38._M_head_impl)->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
      super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  local_38._M_head_impl = (TableFunctionCatalogEntry *)0x0;
  if (local_30._M_head_impl != (TableFunctionCatalogEntry *)0x0) {
    (*((local_30._M_head_impl)->super_FunctionEntry).super_StandardEntry.super_InCatalogEntry.
      super_CatalogEntry._vptr_CatalogEntry[1])();
  }
  return (optional_ptr<duckdb::CatalogEntry,_true>)oVar3.ptr;
}

Assistant:

optional_ptr<CatalogEntry> DuckSchemaEntry::CreateTableFunction(CatalogTransaction transaction,
                                                                CreateTableFunctionInfo &info) {
	auto table_function = make_uniq<TableFunctionCatalogEntry>(catalog, *this, info);
	table_function->internal = info.internal;
	return AddEntry(transaction, std::move(table_function), info.on_conflict);
}